

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void reshape(GLFWwindow *window,int width,int height)

{
  int local_20;
  int local_1c;
  int h;
  int w;
  int height_local;
  int width_local;
  GLFWwindow *window_local;
  
  h = height;
  w = width;
  _height_local = window;
  glfwGetFramebufferSize(window,&local_1c,&local_20);
  glViewport(0,0,local_1c,local_20);
  glMatrixMode(0x1701);
  glLoadIdentity();
  glOrtho(0,(double)w,(double)h,0,0,0x3ff0000000000000);
  glMatrixMode(0x1700);
  glLoadIdentity();
  return;
}

Assistant:

void reshape(GLFWwindow* window, int width, int height ) {
    int w, h;
    glfwGetFramebufferSize(window, &w, &h);
    glViewport(0, 0, w, h);
    glMatrixMode(GL_PROJECTION );
    glLoadIdentity();
    glOrtho(0, width, height, 0, 0, 1);
    glMatrixMode(GL_MODELVIEW );
    glLoadIdentity();
}